

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Metadata::~Metadata(Metadata *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 == (undefined8 *)0x0) {
    SharedDtor(this);
    google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_);
  }
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InnerMap::~InnerMap((InnerMap *)&this->userdefined_);
  google::protobuf::MessageLite::~MessageLite(&this->super_MessageLite);
  return;
}

Assistant:

Metadata::~Metadata() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.Metadata)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}